

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O0

bool __thiscall
LinearSystem::PerformOperation
          (LinearSystem *this,OperationType operation_type,int lhs,int rhs,Fraction coefficient)

{
  bool bVar1;
  undefined1 local_40 [8];
  Operation operation;
  int rhs_local;
  int lhs_local;
  OperationType operation_type_local;
  LinearSystem *this_local;
  Fraction coefficient_local;
  
  operation.coefficient.numerator_ = rhs;
  operation.coefficient.denominator_ = lhs;
  if (operation_type == MainOutput) {
    coefficient_local.numerator_._3_1_ = AddMainOutput(this);
  }
  else {
    Operation::Operation((Operation *)local_40,operation_type,lhs,rhs,coefficient);
    bVar1 = ApplyOperation(this,(Operation *)local_40);
    if (bVar1) {
      std::vector<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>::push_back
                (&this->history_,(value_type *)local_40);
      coefficient_local.numerator_._3_1_ = true;
    }
    else {
      coefficient_local.numerator_._3_1_ = false;
    }
  }
  return coefficient_local.numerator_._3_1_;
}

Assistant:

bool LinearSystem::PerformOperation(LinearSystem::OperationType operation_type, int lhs,
                                    int rhs, Fraction coefficient) {
  if (operation_type == OperationType::MainOutput) {
    return AddMainOutput();
  }

  Operation operation(operation_type, lhs, rhs, coefficient);
  if (ApplyOperation(operation)) {
    history_.push_back(operation);
    return true;
  }

  return false;
}